

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O0

ControlledPollAction __thiscall
aeron::archive::ControlResponsePoller::onFragment
          (ControlResponsePoller *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  uint16_t uVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  index_t iVar4;
  Value VVar5;
  uint8_t *puVar6;
  uint64_t uVar7;
  int64_t iVar8;
  ArchiveException *this_00;
  char *pcVar9;
  allocator local_141;
  string local_140;
  allocator local_119;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_a8;
  undefined1 local_88 [8];
  ControlResponse msg;
  undefined1 local_48 [6];
  uint16_t templateId;
  MessageHeader hdr;
  Header *header_local;
  index_t length_local;
  index_t offset_local;
  AtomicBuffer *buffer_local;
  ControlResponsePoller *this_local;
  
  hdr.m_actingVersion = (uint64_t)header;
  io::aeron::archive::codecs::MessageHeader::MessageHeader((MessageHeader *)local_48);
  puVar6 = concurrent::AtomicBuffer::buffer(buffer);
  iVar4 = concurrent::AtomicBuffer::capacity(buffer);
  io::aeron::archive::codecs::MessageHeader::wrap
            ((MessageHeader *)local_48,(char *)puVar6,(long)offset,0,(long)iVar4);
  uVar1 = io::aeron::archive::codecs::MessageHeader::templateId((MessageHeader *)local_48);
  msg.m_actingVersion._6_2_ = uVar1;
  uVar2 = io::aeron::archive::codecs::ControlResponse::sbeTemplateId();
  uVar3 = msg.m_actingVersion._6_2_;
  if (uVar1 == uVar2) {
    io::aeron::archive::codecs::ControlResponse::ControlResponse((ControlResponse *)local_88);
    puVar6 = concurrent::AtomicBuffer::buffer(buffer);
    uVar7 = io::aeron::archive::codecs::MessageHeader::encodedLength();
    uVar3 = io::aeron::archive::codecs::MessageHeader::blockLength((MessageHeader *)local_48);
    uVar1 = io::aeron::archive::codecs::MessageHeader::version((MessageHeader *)local_48);
    iVar4 = concurrent::AtomicBuffer::capacity(buffer);
    io::aeron::archive::codecs::ControlResponse::wrapForDecode
              ((ControlResponse *)local_88,(char *)puVar6,(long)offset + uVar7,(ulong)uVar3,
               (ulong)uVar1,(long)iVar4);
    iVar8 = io::aeron::archive::codecs::ControlResponse::controlSessionId
                      ((ControlResponse *)local_88);
    this->controlSessionId_ = iVar8;
    iVar8 = io::aeron::archive::codecs::ControlResponse::correlationId((ControlResponse *)local_88);
    this->correlationId_ = iVar8;
    iVar8 = io::aeron::archive::codecs::ControlResponse::relevantId((ControlResponse *)local_88);
    this->relevantId_ = iVar8;
    this->templateId_ = (ulong)msg.m_actingVersion._6_2_;
    VVar5 = io::aeron::archive::codecs::ControlResponse::code((ControlResponse *)local_88);
    this->code_ = VVar5;
    if (this->code_ == ERROR) {
      io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
                (&local_a8,(ControlResponse *)local_88);
      std::__cxx11::string::operator=((string *)&this->errorMessage_,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    else {
      std::__cxx11::string::operator=((string *)&this->errorMessage_,"");
    }
  }
  else {
    uVar1 = io::aeron::archive::codecs::RecordingDescriptor::sbeTemplateId();
    if (uVar3 != uVar1) {
      this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_f8,(uint)msg.m_actingVersion._6_2_);
      std::operator+(&local_d8,"unknown template id: ",&local_f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_118,
                 "ControlledPollAction aeron::archive::ControlResponsePoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                 ,&local_119);
      pcVar9 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ControlResponsePoller.cpp"
                         );
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,pcVar9,&local_141);
      ArchiveException::ArchiveException(this_00,&local_d8,&local_118,&local_140,0x55);
      __cxa_throw(this_00,&ArchiveException::typeinfo,ArchiveException::~ArchiveException);
    }
  }
  this->isPollComplete_ = true;
  return BREAK;
}

Assistant:

ControlledPollAction ControlResponsePoller::onFragment(concurrent::AtomicBuffer& buffer, util::index_t offset,
                                                       util::index_t length, Header& header) {
    codecs::MessageHeader hdr;
    hdr.wrap((char*)buffer.buffer(), offset, 0, buffer.capacity());

    const std::uint16_t templateId = hdr.templateId();

    if (templateId == codecs::ControlResponse::sbeTemplateId()) {
        codecs::ControlResponse msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        controlSessionId_ = msg.controlSessionId();
        correlationId_ = msg.correlationId();
        relevantId_ = msg.relevantId();
        templateId_ = templateId;
        code_ = msg.code();

        if (code_ == codecs::ControlResponseCode::ERROR) {
            errorMessage_ = msg.getErrorMessageAsString();
        } else {
            errorMessage_ = "";
        }
    } else if (templateId != codecs::RecordingDescriptor::sbeTemplateId()) {
        throw ArchiveException("unknown template id: " + std::to_string(templateId), SOURCEINFO);
    }

    isPollComplete_ = true;

    return ControlledPollAction::BREAK;
}